

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool tinyusdz::usda::anon_unknown_1::ConstructPrimTreeRec
               (size_t primIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
               *prim_nodes,Prim *destPrim,string *err)

{
  pointer pPVar1;
  _Base_ptr p_Var2;
  size_t *psVar3;
  bool bVar4;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  size_t *psVar8;
  int64_t vidx;
  VariantSet variantSet;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  variantSets;
  Variant variant;
  Prim prim;
  Prim variantChildPrim;
  ulong local_c38;
  allocator local_c29;
  string *local_c28;
  _Base_ptr local_c20;
  _Rb_tree_node_base *local_c18;
  Prim *local_c10;
  pointer local_c08;
  _Base_ptr local_c00;
  _Base_ptr local_bf8;
  PrimMetas *local_bf0;
  _Rb_tree_node_base *local_be8;
  undefined1 local_be0 [40];
  _Rb_tree_node_base local_bb8;
  size_t local_b98;
  storage_union local_b90;
  undefined **local_b80;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  local_b40;
  undefined1 local_b10 [1088];
  undefined1 local_6d0 [688];
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> local_420 [4];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  local_3b0;
  storage_union local_380;
  undefined **local_370;
  
  if ((destPrim == (Prim *)0x0) ||
     (pPVar1 = (prim_nodes->
               super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
               )._M_impl.super__Vector_impl_data._M_start,
     (ulong)(((long)(prim_nodes->
                    super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0xa8) <= primIdx))
  {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)err);
    }
    bVar4 = false;
  }
  else {
    local_c08 = pPVar1 + primIdx;
    local_c28 = err;
    local_c10 = destPrim;
    Prim::Prim((Prim *)local_6d0,&local_c08->prim);
    ::std::__cxx11::string::_M_assign((string *)(local_6d0 + 0x270));
    local_b70._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b70._M_impl.super__Rb_tree_header._M_header;
    local_b70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b70._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_b40._M_impl.super__Rb_tree_header._M_header;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b40._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c00 = (_Base_ptr)((long)&pPVar1[primIdx].variantNodeMap._M_t._M_impl + 8);
    p_Var7 = *(_Base_ptr *)((long)&pPVar1[primIdx].variantNodeMap._M_t._M_impl + 0x18);
    local_b70._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b70._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b40._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b40._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var7 != local_c00) {
      local_be0._0_8_ = local_be0 + 0x10;
      local_be0._8_8_ = 0;
      local_be0[0x10] = '\0';
      local_bb8._M_color = _S_red;
      local_bb8._M_parent = (_Base_ptr)0x0;
      local_bb8._M_left = &local_bb8;
      local_b98 = 0;
      local_c20 = p_Var7 + 1;
      local_c18 = (_Rb_tree_node_base *)&p_Var7[2]._M_parent;
      local_bf8 = p_Var7;
      local_bb8._M_right = local_bb8._M_left;
      for (p_Var6 = p_Var7[2]._M_right; p_Var6 != local_c18;
          p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
        local_be8 = p_Var6 + 1;
        Variant::Variant((Variant *)local_b10);
        local_bf0 = (PrimMetas *)(p_Var6 + 2);
        p_Var2 = p_Var6[0x23]._M_left;
        for (p_Var7 = p_Var6[0x23]._M_parent; p_Var7 != p_Var2;
            p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
          local_c38 = *(ulong *)p_Var7;
          sVar5 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_b70,
                             (key_type_conflict *)&local_c38);
          if (sVar5 != 0) {
            if (local_c28 != (string *)0x0) {
              ::std::__cxx11::string::string
                        ((string *)&local_b90,"variant primIdx {} is referenced multiple times.\n",
                         &local_c29);
              fmt::format<long>((string *)&local_380,(string *)&local_b90,(long *)&local_c38);
              ::std::__cxx11::string::operator=((string *)local_c28,(string *)&local_380);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            goto LAB_001261c7;
          }
          if (((long)local_c38 < 0) ||
             ((ulong)(((long)(prim_nodes->
                             super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(prim_nodes->
                            super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0xa8) < local_c38)) {
            if (local_c28 != (string *)0x0) {
              ::std::__cxx11::string::assign((char *)local_c28);
            }
            goto LAB_001261c7;
          }
          local_b80 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_b90.dynamic = (void *)0x0;
          Prim::Prim((Prim *)&local_380,(Value *)&local_b90);
          if (local_b80 != (undefined **)0x0) {
            (*(code *)local_b80[4])(&local_b90);
          }
          bVar4 = ConstructPrimTreeRec(local_c38,prim_nodes,(Prim *)&local_380,local_c28);
          if (!bVar4) {
            Prim::~Prim((Prim *)&local_380);
            goto LAB_001261c7;
          }
          ::std::vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>>::
          emplace_back<tinyusdz::Prim&>
                    ((vector<tinyusdz::Prim,std::allocator<tinyusdz::Prim>> *)(local_b10 + 0x428),
                     (Prim *)&local_380);
          Prim::~Prim((Prim *)&local_380);
          ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&local_b70,(long *)&local_c38);
        }
        PrimMetas::operator=((PrimMetas *)(local_b10 + 0x30),local_bf0);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)local_b10,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)&p_Var6[0x21]._M_right);
        ::std::__cxx11::string::_M_assign((string *)local_be0);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Variant>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Variant>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Variant>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Variant>>>
                    *)(local_be0 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8,
                   (Variant *)local_b10);
LAB_001261c7:
        Variant::~Variant((Variant *)local_b10);
        if (p_Var7 != p_Var2) goto LAB_00126200;
      }
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::VariantSet>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSet>>>
                  *)&local_b40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c20,
                 (VariantSet *)local_be0);
LAB_00126200:
      VariantSet::~VariantSet((VariantSet *)local_be0);
      if (p_Var6 != local_c18) goto LAB_00126341;
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(local_bf8);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
    ::_M_move_assign(&local_3b0,&local_b40);
    psVar8 = (local_c08->children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (local_c08->children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_0012628a:
    if (psVar8 == psVar3) {
      Prim::operator=(local_c10,(Prim *)local_6d0);
      bVar4 = true;
    }
    else {
      local_b10._0_8_ = *psVar8;
      sVar5 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_b70,
                         (key_type_conflict *)local_b10);
      if (sVar5 != 0) goto LAB_00126315;
      local_370 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_380.dynamic = (void *)0x0;
      Prim::Prim((Prim *)local_b10,(Value *)&local_380);
      if (local_370 != (undefined **)0x0) {
        (*(code *)local_370[4])(&local_380);
      }
      bVar4 = ConstructPrimTreeRec(*psVar8,prim_nodes,(Prim *)local_b10,local_c28);
      if (bVar4) {
        ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                  (local_420,(Prim *)local_b10);
        Prim::~Prim((Prim *)local_b10);
        goto LAB_00126315;
      }
      Prim::~Prim((Prim *)local_b10);
LAB_00126341:
      bVar4 = false;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
    ::~_Rb_tree(&local_b40);
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_b70);
    Prim::~Prim((Prim *)local_6d0);
  }
  return bVar4;
LAB_00126315:
  psVar8 = psVar8 + 1;
  goto LAB_0012628a;
}

Assistant:

bool ConstructPrimTreeRec(const size_t primIdx,
                        const std::vector<PrimNode> &prim_nodes,
                        Prim *destPrim,
                        std::string *err) {

  if (!destPrim) {
    if (err) {
      (*err) = "`destPrim` is nullptr.\n";
    }
    return false;
  }

  if (primIdx >= prim_nodes.size()) {
    if (err) {
      (*err) = "primIndex exceeds prim_nodes.size()\n";
    }
    return false;
  }

  const auto &node = prim_nodes[primIdx];

  Prim prim(node.prim);
  prim.prim_type_name() = node.typeName;

  DCOUT("prim[" << primIdx << "].type = " << node.prim.type_name());
  DCOUT("prim[" << primIdx << "].variantNodeMap.size = " << node.variantNodeMap.size());
  //prim.prim_id() = int64_t(idx);

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices

  std::map<std::string, VariantSet> variantSets;
  for (const auto &variantNodes : node.variantNodeMap) {
    DCOUT("variantSet " << variantNodes.first);
    VariantSet variantSet;
    for (const auto &item : variantNodes.second) {
      DCOUT("variant " << item.first);
      Variant variant;
      for (const int64_t vidx : item.second.primChildren) {
        if (variantChildrenIndices.count(vidx)) {
          // Duplicated variant childrenIndices
          if (err) {
            (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
          }
          return false;
        } else {
          // Add prim to variants
          if ((vidx >= 0) && (size_t(vidx) <= prim_nodes.size())) {

            Prim variantChildPrim(value::Value(nullptr)); // dummy
            if (!ConstructPrimTreeRec(size_t(vidx), prim_nodes, &variantChildPrim, err)) {
              return false;
            }

            DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.element_name(), variantNodes.first, item.first));
            variant.primChildren().emplace_back(variantChildPrim);
          } else {
            if (err) {
              (*err) = "primIndex exceeds prim_nodes.size()\n";
            }
            return false;
          }

          variantChildrenIndices.insert(vidx);
        }
      }
      variant.metas() = std::move(item.second.metas);
      variant.properties() = std::move(item.second.props);

      variantSet.name = variantNodes.first;
      variantSet.variantSet.emplace(item.first, std::move(variant));
    }
    variantSets.emplace(variantNodes.first, std::move(variantSet));
  }
  prim.variantSets() = std::move(variantSets);

  for (const auto &cidx : node.children) {
    if (variantChildrenIndices.count(int64_t(cidx))) {
      // Prim is processed
      continue;
    }

    Prim childPrim(value::Value(nullptr)); // dummy
    if (!ConstructPrimTreeRec(cidx, prim_nodes, &childPrim, err)) {
      return false;
    }

    prim.children().emplace_back(std::move(childPrim));
  }

  (*destPrim) = std::move(prim);
  return true;
}